

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::QFileDialog(QFileDialog *this,QFileDialogArgs *args)

{
  QFileDialogPrivate *this_00;
  
  this_00 = (QFileDialogPrivate *)operator_new(0x438);
  QFileDialogPrivate::QFileDialogPrivate(this_00);
  QDialog::QDialog(&this->super_QDialog,(QDialogPrivate *)this_00,args->parent,(WindowFlags)0x0);
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_007db860;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QFileDialog_007dba38;
  QFileDialogPrivate::init
            (*(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)args);
  setFileMode(this,args->mode);
  setOptions(this,(Options)(args->options).super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                           super_QFlagsStorage<QFileDialog::Option>.i);
  selectFile(this,&args->selection);
  return;
}

Assistant:

QFileDialog::QFileDialog(const QFileDialogArgs &args)
    : QDialog(*new QFileDialogPrivate, args.parent, { })
{
    Q_D(QFileDialog);
    d->init(args);
    setFileMode(args.mode);
    setOptions(args.options);
    selectFile(args.selection);
}